

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QList<Qt::GestureType> * __thiscall
QHash<Qt::GestureType,_int>::keys
          (QList<Qt::GestureType> *__return_storage_ptr__,QHash<Qt::GestureType,_int> *this)

{
  const_iterator i1;
  
  i1 = begin(this);
  QList<Qt::GestureType>::QList<QHash<Qt::GestureType,_int>::key_iterator,_true>
            (__return_storage_ptr__,(key_iterator)i1.i,(key_iterator)ZEXT816(0));
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }